

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::handleCoopMat2FunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *fnCandidate,TIntermTyped *result,
          TIntermNode *arguments)

{
  TInfoSink *pTVar1;
  TIntermediate *this_00;
  TSymbolTable *pTVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  long *plVar9;
  TString *pTVar10;
  TSymbol *pTVar11;
  undefined4 extraout_var_01;
  long lVar12;
  long *plVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TType *pTVar14;
  TType *right;
  long *plVar15;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TPoolAllocator *pTVar16;
  TArraySizes *pTVar17;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TIntermTyped *pTVar18;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  _func_int **pp_Var19;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  TIntermNode *pTVar24;
  undefined1 auVar25 [16];
  TType resultType;
  TType local_c8;
  undefined4 extraout_var_15;
  
  if ((arguments != (TIntermNode *)0x0) &&
     (iVar5 = (*arguments->_vptr_TIntermNode[6])(), CONCAT44(extraout_var,iVar5) != 0)) {
    iVar5 = (*arguments->_vptr_TIntermNode[6])();
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 400))
                      ((long *)CONCAT44(extraout_var_00,iVar5));
    lVar12 = *(long *)(lVar8 + 8);
    if (*(long *)(lVar8 + 0x10) != lVar12) {
      uVar23 = 0;
      do {
        plVar15 = *(long **)(lVar12 + uVar23 * 8);
        plVar9 = (long *)(**(code **)(*plVar15 + 0x18))(plVar15);
        iVar5 = (**(code **)(*plVar9 + 0x100))(plVar9);
        if (iVar5 == 0x16) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.infoSink;
          this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          plVar9 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
          pTVar10 = (TString *)(**(code **)(*plVar9 + 0x198))(plVar9);
          TIntermediate::addToCallGraph(this_00,pTVar1,&this->currentCaller,pTVar10);
          iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
          if (((iVar5 == 0x14b) ||
              (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar5 == 0x14e)) ||
             (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar5 == 0x14f)) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar9 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
            pTVar10 = (TString *)(**(code **)(*plVar9 + 0x198))(plVar9);
            pTVar11 = TSymbolTable::find(pTVar2,pTVar10,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar5 = (*pTVar11->_vptr_TSymbol[7])(pTVar11);
            plVar9 = (long *)CONCAT44(extraout_var_01,iVar5);
            iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
            if (0 < iVar5) {
              iVar5 = 0;
              do {
                lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,iVar5);
                lVar12 = (**(code **)(**(long **)(lVar12 + 8) + 0x50))();
                if ((*(uint *)(lVar12 + 8) & 0x7f) != 0x13) {
                  plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
                  lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"function parameters must all be qualified \'const in\'",
                             *(undefined8 *)(lVar12 + 8));
                }
                iVar5 = iVar5 + 1;
                iVar6 = (**(code **)(*plVar9 + 0x120))(plVar9);
              } while (iVar5 < iVar6);
            }
          }
          iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
          if (iVar5 == 0x14b) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar9 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
            pTVar10 = (TString *)(**(code **)(*plVar9 + 0x198))(plVar9);
            pTVar11 = TSymbolTable::find(pTVar2,pTVar10,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar5 = (*pTVar11->_vptr_TSymbol[7])(pTVar11);
            plVar9 = (long *)CONCAT44(extraout_var_02,iVar5);
            iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
            if (iVar5 != 3) {
              plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
              lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"must have three parameters",*(undefined8 *)(lVar12 + 8));
            }
            lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,0);
            iVar5 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
            if (iVar5 != 0x12) {
              plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
              lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"first parameter must be buffer reference type",
                         *(undefined8 *)(lVar12 + 8));
            }
            lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,1);
            iVar5 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
            if (iVar5 == 9) {
              lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,2);
              iVar5 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
              if (iVar5 != 9) goto LAB_004ac920;
            }
            else {
LAB_004ac920:
              plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
              lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"coordinate parameters must be uint32_t",
                         *(undefined8 *)(lVar12 + 8));
            }
            lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,1);
            cVar3 = (**(code **)(**(long **)(lVar12 + 8) + 0xe8))();
            if (cVar3 != '\0') {
              lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,2);
              cVar3 = (**(code **)(**(long **)(lVar12 + 8) + 0xe8))();
              if (cVar3 != '\0') goto LAB_004ac9dc;
            }
            plVar9 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
            lVar12 = (**(code **)(*plVar9 + 0x198))(plVar9);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"coordinate parameters must be uint32_t",*(undefined8 *)(lVar12 + 8)
                      );
          }
LAB_004ac9dc:
          iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
          if (iVar5 == 0x14e) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar9 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
            pTVar10 = (TString *)(**(code **)(*plVar9 + 0x198))(plVar9);
            pTVar11 = TSymbolTable::find(pTVar2,pTVar10,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar5 = (*pTVar11->_vptr_TSymbol[7])(pTVar11);
            plVar9 = (long *)CONCAT44(extraout_var_03,iVar5);
            iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
            if (iVar5 != 2) {
              plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
              lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"must have two parameters",*(undefined8 *)(lVar12 + 8));
            }
            iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
            if (0 < iVar5) {
              iVar5 = 0;
              do {
                lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,iVar5);
                plVar13 = (long *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
                plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
                iVar6 = (**(code **)(*plVar13 + 0x38))(plVar13);
                iVar7 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
                if (iVar6 != iVar7) {
                  plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
                  lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"parameter types must match cooperative matrix component type"
                             ,*(undefined8 *)(lVar12 + 8));
                }
                iVar5 = iVar5 + 1;
                iVar6 = (**(code **)(*plVar9 + 0x120))(plVar9);
              } while (iVar5 < iVar6);
            }
            plVar13 = (long *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
            plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
            iVar5 = (**(code **)(*plVar13 + 0x38))(plVar13);
            plVar9 = (long *)(**(code **)(*plVar9 + 0x60))(plVar9);
            iVar6 = (**(code **)(*plVar9 + 0x38))(plVar9);
            if (iVar5 != iVar6) {
              plVar9 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
              lVar12 = (**(code **)(*plVar9 + 0x198))(plVar9);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"return type must match cooperative matrix component type",
                         *(undefined8 *)(lVar12 + 8));
            }
          }
          iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
          if (iVar5 == 0x14f) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar9 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
            pTVar10 = (TString *)(**(code **)(*plVar9 + 0x198))(plVar9);
            pTVar11 = TSymbolTable::find(pTVar2,pTVar10,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar5 = (*pTVar11->_vptr_TSymbol[7])(pTVar11);
            plVar9 = (long *)CONCAT44(extraout_var_04,iVar5);
            plVar13 = (long *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
            pTVar14 = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
            plVar13 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar8 + 8) + 0x18))();
            right = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
            bVar4 = TType::operator==(pTVar14,right);
            if (!bVar4) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"cooperative matrix input and result types must match");
            }
            iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
            pcVar20 = "not enough parameters";
            if (2 < iVar5) {
              iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
              pcVar20 = "number of parameters must match call to coopMatPerElementNV";
              if (iVar5 == (int)((ulong)(*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8)) >> 3)) {
                lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,0);
                iVar5 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
                if (iVar5 == 9) {
                  lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,1);
                  iVar5 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
                  if (iVar5 != 9) goto LAB_004acd0d;
                }
                else {
LAB_004acd0d:
                  plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
                  lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"row/column parameters must be uint32_t",
                             *(undefined8 *)(lVar12 + 8));
                }
                lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,2);
                plVar13 = (long *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
                plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
                iVar5 = (**(code **)(*plVar13 + 0x38))(plVar13);
                iVar6 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
                if (iVar5 != iVar6) {
                  plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
                  lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"third parameter must match cooperative matrix component type"
                             ,*(undefined8 *)(lVar12 + 8));
                }
                iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
                if (3 < iVar5) {
                  uVar21 = 3;
                  do {
                    lVar12 = (**(code **)(*plVar9 + 0x140))(plVar9,uVar21 & 0xffffffff);
                    plVar13 = (long *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + uVar21 * 8) +
                                                  0x18))();
                    plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
                    iVar5 = (**(code **)(*plVar13 + 0x38))(plVar13);
                    iVar6 = (**(code **)(**(long **)(lVar12 + 8) + 0x38))();
                    if (iVar5 != iVar6) {
                      plVar13 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
                      lVar12 = (**(code **)(*plVar13 + 0x198))(plVar13);
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                        [0x2d])(this,loc,
                                "parameter types must match or be cooperative matrix component type"
                                ,*(undefined8 *)(lVar12 + 8));
                    }
                    uVar21 = uVar21 + 1;
                    iVar5 = (**(code **)(*plVar9 + 0x120))(plVar9);
                  } while ((long)uVar21 < (long)iVar5);
                }
                plVar13 = (long *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
                plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
                iVar5 = (**(code **)(*plVar13 + 0x38))(plVar13);
                plVar9 = (long *)(**(code **)(*plVar9 + 0x60))(plVar9);
                iVar6 = (**(code **)(*plVar9 + 0x38))(plVar9);
                pcVar20 = "return type must match cooperative matrix component type";
                if (iVar5 == iVar6) goto LAB_004acf16;
              }
            }
            plVar15 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
            lVar12 = (**(code **)(*plVar15 + 0x198))(plVar15);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,pcVar20,*(undefined8 *)(lVar12 + 8));
          }
        }
LAB_004acf16:
        uVar23 = (ulong)((int)uVar23 + 1);
        lVar12 = *(long *)(lVar8 + 8);
      } while (uVar23 < (ulong)(*(long *)(lVar8 + 0x10) - lVar12 >> 3));
    }
  }
  iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0xf0))
                     ((long *)CONCAT44(extraout_var_05,iVar5));
  if ((*(byte *)(lVar12 + 10) & 0x60) == 0) {
    iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
    plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0xf0))
                                ((long *)CONCAT44(extraout_var_06,iVar5));
    iVar5 = (**(code **)(*plVar15 + 0x38))(plVar15);
    if (iVar5 != 0x17) {
      iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0xf0))
                                  ((long *)CONCAT44(extraout_var_07,iVar5));
      iVar5 = (**(code **)(*plVar15 + 0x38))(plVar15);
      if (iVar5 != 0x18) {
        return;
      }
    }
  }
  iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
  plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0xf0))
                              ((long *)CONCAT44(extraout_var_08,iVar5));
  cVar3 = (**(code **)(*plVar15 + 0x188))(plVar15);
  if (cVar3 == '\0') {
    iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
    if ((((iVar5 != 0x148) &&
         (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar5 != 0x14d))
        && ((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
            iVar5 != 0x14e &&
            ((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 != 0x14f &&
             (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 != 0x150)))))) &&
       (((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar5 != 0x151
         && ((((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar5 != 0x153 &&
               (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar5 != 0x152)) &&
              (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar5 != 0x154)) &&
             ((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar5 != 0x155 &&
              (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar5 != 0x156)))))) &&
        (((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar5 != 0x157
          && ((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar5 != 0x158 &&
              (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar5 != 0x159)))) &&
         (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar5 != 0x15a))
        )))) {
      __assert_fail("fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV || fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV || fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x672,
                    "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                   );
    }
    iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
    if (iVar5 == 0x151) {
      pTVar16 = GetThreadPoolAllocator();
      pTVar17 = (TArraySizes *)TPoolAllocator::allocate(pTVar16,0x18);
      (pTVar17->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00b092a0;
      (pTVar17->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      pTVar17->implicitArraySize = 0;
      pTVar17->implicitlySized = true;
      pTVar17->variablyIndexed = false;
      uVar23 = 0;
      do {
        iVar5 = (*arguments->_vptr_TIntermNode[5])(arguments);
        if (CONCAT44(extraout_var_09,iVar5) == 0) {
          iVar5 = (*arguments->_vptr_TIntermNode[6])(arguments);
          if (CONCAT44(extraout_var_10,iVar5) == 0) {
            __assert_fail("arguments->getAsAggregate()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x67f,
                          "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                         );
          }
          iVar5 = (*arguments->_vptr_TIntermNode[6])(arguments);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar5) + 400))
                             ((long *)CONCAT44(extraout_var_11,iVar5));
          if (uVar23 < (ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8) >> 3)) {
            pTVar24 = *(TIntermNode **)(*(long *)(lVar12 + 8) + uVar23 * 8);
          }
          else {
            pTVar24 = (TIntermNode *)0x0;
          }
        }
        else {
          pTVar24 = (TIntermNode *)0x0;
          if (uVar23 == 0) {
            pTVar24 = arguments;
          }
        }
        if (pTVar24 == (TIntermNode *)0x0) {
          uVar22 = 0;
LAB_004ad21f:
          pTVar18 = (TIntermTyped *)0x0;
        }
        else {
          iVar5 = (*pTVar24->_vptr_TIntermNode[3])(pTVar24);
          plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar5) + 0xf0))
                                      ((long *)CONCAT44(extraout_var_12,iVar5));
          lVar12 = (**(code **)(*plVar15 + 0x58))(plVar15);
          if ((*(ulong *)(lVar12 + 8) & 0x100000000) == 0) {
            iVar5 = (*pTVar24->_vptr_TIntermNode[5])(pTVar24);
            uVar22 = **(uint **)(*(long *)(CONCAT44(extraout_var_13,iVar5) + 0xc0) + 8);
            goto LAB_004ad21f;
          }
          iVar5 = (*pTVar24->_vptr_TIntermNode[0xc])(pTVar24);
          uVar22 = **(uint **)(*(long *)(CONCAT44(extraout_var_14,iVar5) + 0x128) + 8);
          iVar5 = (*pTVar24->_vptr_TIntermNode[3])(pTVar24);
          pTVar18 = (TIntermTyped *)CONCAT44(extraout_var_15,iVar5);
        }
        TSmallArrayVector::push_back((TSmallArrayVector *)pTVar17,uVar22,pTVar18);
        uVar23 = uVar23 + 1;
      } while (uVar23 == 1);
      TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar5) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_16,iVar5));
      TType::deepCopy(&local_c8,pTVar14);
      pTVar16 = GetThreadPoolAllocator();
      local_c8.typeParameters = (TTypeParameters *)TPoolAllocator::allocate(pTVar16,0x18);
      (local_c8.typeParameters)->basicType = EbtVoid;
      (local_c8.typeParameters)->arraySizes = (TArraySizes *)0x0;
      (local_c8.typeParameters)->spirvType = (TSpirvType *)0x0;
      (local_c8.typeParameters)->basicType = EbtVoid;
      (local_c8.typeParameters)->arraySizes = pTVar17;
      (local_c8.typeParameters)->spirvType = (TSpirvType *)0x0;
      pp_Var19 = (result->super_TIntermNode)._vptr_TIntermNode;
    }
    else {
      iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
      if (iVar5 != 0x157) {
        iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
        if (((((iVar5 == 0x14e) ||
              (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar5 == 0x14f)) ||
             (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 == 0x150)) ||
            ((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 == 0x153 ||
             (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 == 0x152)))) ||
           ((((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar5 == 0x154 ||
              ((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar5 == 0x155 ||
               (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar5 == 0x156)))) ||
             (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 == 0x158)) ||
            ((iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 == 0x159 ||
             (iVar5 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar5 == 0x15a)))))) {
          iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(result);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar5) + 400))
                             ((long *)CONCAT44(extraout_var_25,iVar5));
          plVar15 = (long *)**(undefined8 **)(lVar12 + 8);
        }
        else {
          iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(result);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar5) + 400))
                             ((long *)CONCAT44(extraout_var_26,iVar5));
          plVar15 = *(long **)(*(long *)(lVar12 + 8) + 0x10);
        }
        plVar15 = (long *)(**(code **)(*plVar15 + 0x18))();
        auVar25 = (**(code **)(*plVar15 + 0xf0))(plVar15);
        UNRECOVERED_JUMPTABLE = (result->super_TIntermNode)._vptr_TIntermNode[0x1d];
        (*UNRECOVERED_JUMPTABLE)(result,auVar25._0_8_,auVar25._8_8_,UNRECOVERED_JUMPTABLE);
        return;
      }
      pTVar16 = GetThreadPoolAllocator();
      pTVar17 = (TArraySizes *)TPoolAllocator::allocate(pTVar16,0x18);
      (pTVar17->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00b092a0;
      (pTVar17->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      pTVar17->implicitArraySize = 0;
      pTVar17->implicitlySized = true;
      pTVar17->variablyIndexed = false;
      uVar23 = 0;
      do {
        iVar5 = (*arguments->_vptr_TIntermNode[5])(arguments);
        if (CONCAT44(extraout_var_17,iVar5) == 0) {
          iVar5 = (*arguments->_vptr_TIntermNode[6])(arguments);
          if (CONCAT44(extraout_var_18,iVar5) == 0) {
            __assert_fail("arguments->getAsAggregate()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x6a5,
                          "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                         );
          }
          iVar5 = (*arguments->_vptr_TIntermNode[6])(arguments);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar5) + 400))
                             ((long *)CONCAT44(extraout_var_19,iVar5));
          if (uVar23 < (ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8) >> 3)) {
            pTVar24 = *(TIntermNode **)(*(long *)(lVar12 + 8) + uVar23 * 8);
          }
          else {
            pTVar24 = (TIntermNode *)0x0;
          }
        }
        else {
          pTVar24 = (TIntermNode *)0x0;
          if (uVar23 == 0) {
            pTVar24 = arguments;
          }
        }
        if (pTVar24 == (TIntermNode *)0x0) {
          uVar22 = (int)uVar23 - 2;
          if (uVar23 < 2) {
            uVar22 = 0;
          }
LAB_004ad3e8:
          pTVar18 = (TIntermTyped *)0x0;
        }
        else {
          iVar5 = (*pTVar24->_vptr_TIntermNode[3])(pTVar24);
          plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_20,iVar5) + 0xf0))
                                      ((long *)CONCAT44(extraout_var_20,iVar5));
          lVar12 = (**(code **)(*plVar15 + 0x58))(plVar15);
          if ((*(ulong *)(lVar12 + 8) & 0x100000000) == 0) {
            iVar5 = (*pTVar24->_vptr_TIntermNode[5])(pTVar24);
            uVar22 = **(uint **)(*(long *)(CONCAT44(extraout_var_21,iVar5) + 0xc0) + 8);
            goto LAB_004ad3e8;
          }
          iVar5 = (*pTVar24->_vptr_TIntermNode[0xc])(pTVar24);
          uVar22 = **(uint **)(*(long *)(CONCAT44(extraout_var_22,iVar5) + 0x128) + 8);
          iVar5 = (*pTVar24->_vptr_TIntermNode[3])(pTVar24);
          pTVar18 = (TIntermTyped *)CONCAT44(extraout_var_23,iVar5);
        }
        TSmallArrayVector::push_back((TSmallArrayVector *)pTVar17,uVar22,pTVar18);
        uVar23 = uVar23 + 1;
      } while (uVar23 != 7);
      TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_24,iVar5) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_24,iVar5));
      TType::deepCopy(&local_c8,pTVar14);
      pTVar16 = GetThreadPoolAllocator();
      local_c8.typeParameters = (TTypeParameters *)TPoolAllocator::allocate(pTVar16,0x18);
      (local_c8.typeParameters)->basicType = EbtVoid;
      (local_c8.typeParameters)->arraySizes = (TArraySizes *)0x0;
      (local_c8.typeParameters)->spirvType = (TSpirvType *)0x0;
      (local_c8.typeParameters)->basicType = EbtVoid;
      (local_c8.typeParameters)->arraySizes = pTVar17;
      (local_c8.typeParameters)->spirvType = (TSpirvType *)0x0;
      pp_Var19 = (result->super_TIntermNode)._vptr_TIntermNode;
    }
    (*pp_Var19[0x1d])(result,&local_c8);
  }
  return;
}

Assistant:

void TParseContext::handleCoopMat2FunctionCall(const TSourceLoc& loc, const TFunction* fnCandidate, TIntermTyped* result, TIntermNode* arguments)
{
    if (arguments && arguments->getAsAggregate()) {
        auto &sequence = arguments->getAsAggregate()->getSequence();
        for (uint32_t i = 0; i < sequence.size(); ++i) {
            auto param = sequence[i];
            if (param->getAsTyped()->getBasicType() == EbtFunction) {
                // Add the function to the callgraph
                intermediate.addToCallGraph(infoSink, currentCaller, param->getAsSymbolNode()->getMangledName());

                // error checking that all parameters are 'const in'
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* func = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();
                    for (int i = 0; i < func->getParamCount(); ++i) {
                        const TParameter& arg = (*func)[i];
                        const TQualifier& formalQualifier = arg.type->getQualifier();
                        if (formalQualifier.storage != EvqConstReadOnly) {
                            error(loc, "function parameters must all be qualified 'const in'", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }

                // error checking decodeFunc parameters are (reference, uint32_t[], uint32_t[])
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV) {
                    const TFunction* decodeFunc = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (decodeFunc->getParamCount() != 3) {
                        error(loc, "must have three parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    if ((*decodeFunc)[0].type->getBasicType() != EbtReference) {
                        error(loc, "first parameter must be buffer reference type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if ((*decodeFunc)[1].type->getBasicType() != EbtUint || (*decodeFunc)[2].type->getBasicType() != EbtUint) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if (!(*decodeFunc)[1].type->isArray() || !(*decodeFunc)[2].type->isArray()) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking reduce function has matching parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV) {
                    const TFunction* combineOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (combineOp->getParamCount() != 2) {
                        error(loc, "must have two parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    for (int i = 0; i < combineOp->getParamCount(); ++i) {
                        const TParameter& arg = (*combineOp)[i];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                            error(loc, "parameter types must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                    if (sequence[1]->getAsTyped()->getType().getBasicType() != combineOp->getType().getBasicType()) {
                        error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking perelement op has correct parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* elemOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (sequence[1]->getAsTyped()->getType() != sequence[0]->getAsTyped()->getType()) {
                        error(loc, "cooperative matrix input and result types must match", "", "");
                    }

                    if (elemOp->getParamCount() < 3) {
                        error(loc, "not enough parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else if (elemOp->getParamCount() != (int)sequence.size()) {
                        error(loc, "number of parameters must match call to coopMatPerElementNV", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else {
                        if ((*elemOp)[0].type->getBasicType() != EbtUint || (*elemOp)[1].type->getBasicType() != EbtUint) {
                            error(loc, "row/column parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        const TParameter& matArg = (*elemOp)[2];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != matArg.type->getBasicType()) {
                            error(loc, "third parameter must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        for (int i = 3; i < elemOp->getParamCount(); ++i) {
                            const TParameter& arg = (*elemOp)[i];
                            if (sequence[i]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                                error(loc, "parameter types must match or be cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                            }
                        }
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != elemOp->getType().getBasicType()) {
                            error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }
            }
        }
    }
    if ((result->getAsTyped()->getType().isCoopMat() ||
         result->getAsTyped()->getType().isTensorLayoutNV() ||
         result->getAsTyped()->getType().isTensorViewNV()) &&
       !result->getAsTyped()->getType().isParameterized()) {
        assert(fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV);

        if (fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 2; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    // gl_CooperativeMatrixClampModeUndefined
                    arraySizes->addInnerSize(0);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 7; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    uint32_t value = 0;
                    if (i >= 2) {
                        // default permutation values are an increasing sequence
                        value = i - 2;
                    }
                    arraySizes->addInnerSize(value);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV) {
            // Set result type to match type of first parameter
            result->setType(result->getAsAggregate()->getSequence()[0]->getAsTyped()->getType());
        } else {
            // For MulAdd, set result type to match type of C parameter
            result->setType(result->getAsAggregate()->getSequence()[2]->getAsTyped()->getType());
        }
    }
}